

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

int get_int_options(char *json_string,char *option_name,int *result)

{
  json_t *root_00;
  longlong lVar1;
  json_t *root;
  int *result_local;
  char *option_name_local;
  char *json_string_local;
  
  *result = -1;
  root_00 = get_root_option_json_object(json_string);
  if (root_00 == (json_t *)0x0) {
    json_string_local._4_4_ = -1;
  }
  else {
    lVar1 = get_int_options_inner(root_00,option_name,result,1);
    json_string_local._4_4_ = (int)lVar1;
  }
  return json_string_local._4_4_;
}

Assistant:

int get_int_options(const char * json_string, const char * option_name, int * result)
{
	json_t * root;

	*result = -1;
	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;
	return (int)get_int_options_inner(root, option_name, result, 1);
}